

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.h
# Opt level: O2

shared_ptr<chrono::fea::ChNodeFEAxyz> __thiscall
chrono::fea::ChElementHexaANCF_3843::GetHexahedronNode(ChElementHexaANCF_3843 *this,int n)

{
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar1;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzDDD,void>
            ((__shared_ptr<chrono::fea::ChNodeFEAxyz,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)in_EDX * 0x10 + *(long *)(CONCAT44(in_register_00000034,n) + 0x68)));
  sVar1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAxyz>)
         sVar1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChNodeFEAxyz> GetHexahedronNode(int n) override { return m_nodes[n]; }